

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ParseMachOHeader<bloaty::macho::ParseLoadCommands(bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_8_1_89918b91 *loadcmd_func)

{
  char *pcVar1;
  uint64_t end;
  uint32_t *puVar2;
  int *piVar3;
  ulong uVar4;
  char *in_R8;
  char *pcVar5;
  int iVar6;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  LoadCommand local_58;
  
  piVar3 = (int *)macho_file._M_str;
  uVar4 = macho_file._M_len;
  if (uVar4 < 4) {
    Throw("Malformed Mach-O file",0x2c);
  }
  iVar6 = *piVar3;
  if (iVar6 < -0x1120531) {
    if (iVar6 != -0x1120532) {
      if ((iVar6 == -0x31051202) || (iVar6 == -0x30051202)) {
        Throw("We don\'t support cross-endian Mach-O files.",0x97);
      }
LAB_0018e892:
      Throw("Corrupt Mach-O file",0x99);
    }
    if (uVar4 < 0x1c) {
LAB_0018e817:
      Throw("Premature EOF reading Mach-O data.",0x36);
    }
    data._M_str = in_R8;
    data._M_len = (size_t)piVar3;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x1c,data);
    iVar6 = piVar3[4];
    if (iVar6 != 0) {
      puVar2 = (uint32_t *)(piVar3 + 7);
      pcVar5 = (char *)(uVar4 - 0x1c);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_0018e817;
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar1 == (char *)0x0) {
LAB_0018e828:
          Throw("Mach-O load command had zero size.",0x66);
        }
        local_58.is64bit = false;
        local_58.cmd = *puVar2;
        if (pcVar5 < pcVar1) {
LAB_0018e839:
          Throw("region out-of-bounds",0x5d);
        }
        local_58.command_data._M_len = (size_t)pcVar1;
        local_58.command_data._M_str = (char *)puVar2;
        local_58.file_data._M_len = uVar4;
        local_58.file_data._M_str = (char *)piVar3;
        ParseLoadCommand(&local_58,loadcmd_func->sink);
        data_00._M_str = in_R8;
        data_00._M_len = (size_t)puVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_00);
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar5 < pcVar1) {
LAB_0018e84a:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar1,pcVar5);
        }
        puVar2 = (uint32_t *)((long)puVar2 + (long)pcVar1);
        iVar6 = iVar6 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar6 != 0);
    }
  }
  else {
    if (iVar6 != -0x1120531) goto LAB_0018e892;
    if (uVar4 < 0x20) goto LAB_0018e817;
    data_01._M_str = in_R8;
    data_01._M_len = (size_t)piVar3;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x20,data_01);
    iVar6 = piVar3[4];
    if (iVar6 != 0) {
      puVar2 = (uint32_t *)(piVar3 + 8);
      pcVar5 = (char *)(uVar4 - 0x20);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_0018e817;
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar1 == (char *)0x0) goto LAB_0018e828;
        local_58.is64bit = true;
        local_58.cmd = *puVar2;
        if (pcVar5 < pcVar1) goto LAB_0018e839;
        local_58.command_data._M_len = (size_t)pcVar1;
        local_58.command_data._M_str = (char *)puVar2;
        local_58.file_data._M_len = uVar4;
        local_58.file_data._M_str = (char *)piVar3;
        ParseLoadCommand(&local_58,loadcmd_func->sink);
        data_02._M_str = in_R8;
        data_02._M_len = (size_t)puVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_02);
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar5 < pcVar1) goto LAB_0018e84a;
        puVar2 = (uint32_t *)((long)puVar2 + (long)pcVar1);
        iVar6 = iVar6 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar6 != 0);
    }
  }
  return;
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}